

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

bool lsim::deserialize_library(LSimContext *context,ModelCircuitLibrary *lib,char *filename)

{
  string *psVar1;
  mapped_type mVar2;
  uint uVar3;
  char *pcVar4;
  undefined1 uVar5;
  LSimContext *this;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  int iVar10;
  xml_node *pxVar11;
  char_t *pcVar12;
  char_t *filename_00;
  const_iterator cVar13;
  ModelComponent *this_00;
  Property *pPVar14;
  mapped_type *pmVar15;
  long lVar16;
  ulong uVar17;
  ModelCircuit *this_01;
  ulong uVar18;
  size_t idx;
  _Hash_node_base *p_Var19;
  float fVar20;
  float fVar21;
  xml_node pos_node;
  xml_node orient_node;
  xml_node comp_node;
  xml_attribute prop_tristate;
  xml_node initial_output_node;
  xml_node desc_node;
  xml_attribute controls_attr;
  xml_node circuit_node;
  xml_node lsim_node;
  xml_node main_node;
  xml_node ref_node;
  xml_named_node_iterator __begin2;
  xml_attribute type_attr;
  xml_attribute attr_name;
  xml_attribute outputs_attr;
  xml_attribute attr_file;
  xml_named_node_iterator __begin2_1;
  xml_named_node_iterator __end2;
  xml_named_node_iterator __end2_1;
  Deserializer deserializer;
  xml_attribute local_320;
  xml_attribute local_318;
  xml_node local_310;
  xml_attribute local_308;
  undefined1 local_2f9;
  ModelCircuit *local_2f8;
  xml_attribute local_2f0;
  Point local_2e8;
  ModelCircuitLibrary *local_2e0;
  Point local_2d8;
  xml_attribute local_2d0;
  xml_node local_2c8;
  xml_node local_2c0;
  xml_object_range<pugi::xml_named_node_iterator> local_2b8;
  undefined1 local_288 [32];
  undefined1 local_268 [16];
  undefined1 local_258 [40];
  xml_node_struct *pxStack_230;
  xml_node_struct *local_228;
  xml_named_node_iterator local_218;
  ModelWire *local_200;
  xml_named_node_iterator local_1f8;
  xml_named_node_iterator local_1d8;
  xml_named_node_iterator local_1b8;
  xml_object_range<pugi::xml_named_node_iterator> local_198;
  xml_named_node_iterator local_168;
  xml_document local_148;
  LSimContext *local_78;
  ModelCircuitLibrary *local_70;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (context == (LSimContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x23e,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  local_2e0 = lib;
  if (lib == (ModelCircuitLibrary *)0x0) {
    __assert_fail("lib",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x23f,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  if (filename == (char *)0x0) {
    __assert_fail("filename",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                  ,0x240,
                  "bool lsim::deserialize_library(LSimContext *, ModelCircuitLibrary *, const char *)"
                 );
  }
  pugi::xml_document::xml_document(&local_148);
  local_70 = (ModelCircuitLibrary *)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  local_78 = context;
  pugi::xml_document::load_file
            ((xml_parse_result *)&local_2b8,&local_148,filename,0x74,encoding_auto);
  local_2f9 = pugi::xml_parse_result::operator_cast_to_bool((xml_parse_result *)&local_2b8);
  if ((bool)local_2f9) {
    local_70 = local_2e0;
    local_2c0 = pugi::xml_node::child(&local_148.super_xml_node,"lsim");
    bVar6 = pugi::xml_node::operator!(&local_2c0);
    if (!bVar6) {
      pugi::xml_node::children(&local_2b8,&local_2c0,"reference");
      local_258._0_8_ = local_2b8._begin._name;
      local_268._0_8_ = local_2b8._begin._wrap._root;
      local_268._8_8_ = local_2b8._begin._parent._root;
      local_198._begin._name = local_2b8._end._name;
      local_198._begin._wrap._root = local_2b8._end._wrap._root;
      local_198._begin._parent._root = local_2b8._end._parent._root;
      bVar6 = pugi::xml_named_node_iterator::operator!=
                        ((xml_named_node_iterator *)local_268,&local_198._begin);
      if (bVar6) {
        do {
          pxVar11 = pugi::xml_named_node_iterator::operator*((xml_named_node_iterator *)local_268);
          local_288._0_8_ = pxVar11->_root;
          local_218._wrap._root =
               (xml_node_struct *)pugi::xml_node::attribute((xml_node *)local_288,"name");
          bVar6 = pugi::xml_attribute::operator!((xml_attribute *)&local_218);
          if (bVar6) goto LAB_00184018;
          local_1d8._wrap._root =
               (xml_node_struct *)pugi::xml_node::attribute((xml_node *)local_288,"file");
          bVar6 = pugi::xml_attribute::operator!((xml_attribute *)&local_1d8);
          this = local_78;
          if (bVar6) goto LAB_00184018;
          pcVar12 = pugi::xml_attribute::value((xml_attribute *)&local_218);
          filename_00 = pugi::xml_attribute::value((xml_attribute *)&local_1d8);
          LSimContext::load_reference_library(this,pcVar12,filename_00);
          pcVar12 = pugi::xml_attribute::value((xml_attribute *)&local_218);
          ModelCircuitLibrary::add_reference(local_2e0,pcVar12);
          pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)local_268);
          bVar6 = pugi::xml_named_node_iterator::operator!=
                            ((xml_named_node_iterator *)local_268,&local_198._begin);
        } while (bVar6);
      }
      pugi::xml_node::children(&local_198,&local_2c0,"circuit");
      local_1b8._name = local_198._begin._name;
      local_1b8._wrap._root = local_198._begin._wrap._root;
      local_1b8._parent._root = local_198._begin._parent._root;
      local_168._name = local_198._end._name;
      local_168._wrap._root = local_198._end._wrap._root;
      local_168._parent._root = local_198._end._parent._root;
      bVar6 = pugi::xml_named_node_iterator::operator!=(&local_1b8,&local_168);
      if (bVar6) {
        do {
          pxVar11 = pugi::xml_named_node_iterator::operator*(&local_1b8);
          local_2c8._root = pxVar11->_root;
          local_2b8._begin._wrap._root =
               (xml_node_struct *)pugi::xml_node::attribute(&local_2c8,"name");
          pcVar12 = pugi::xml_attribute::as_string((xml_attribute *)&local_2b8,"");
          if ((pcVar12 != (char_t *)0x0) &&
             (local_2f8 = ModelCircuitLibrary::create_circuit(local_70,pcVar12,local_78),
             local_2f8 != (ModelCircuit *)0x0)) {
            pugi::xml_node::children(&local_2b8,&local_2c8,"component");
            local_288._16_8_ = local_2b8._begin._name;
            local_288._0_8_ = local_2b8._begin._wrap._root;
            local_288._8_8_ = local_2b8._begin._parent._root;
            local_218._name = local_2b8._end._name;
            local_218._wrap._root = local_2b8._end._wrap._root;
            local_218._parent._root = local_2b8._end._parent._root;
            bVar6 = pugi::xml_named_node_iterator::operator!=
                              ((xml_named_node_iterator *)local_288,&local_218);
            while (bVar6 != false) {
              pxVar11 = pugi::xml_named_node_iterator::operator*
                                  ((xml_named_node_iterator *)local_288);
              local_310._root = pxVar11->_root;
              local_1d8._wrap._root = (xml_node_struct *)pugi::xml_node::attribute(&local_310,"id");
              bVar6 = pugi::xml_attribute::operator!((xml_attribute *)&local_1d8);
              if (bVar6) goto switchD_00182ee9_caseD_5;
              local_258._32_8_ = pugi::xml_node::attribute(&local_310,"type");
              bVar6 = pugi::xml_attribute::operator!((xml_attribute *)(local_258 + 0x20));
              if (bVar6) goto switchD_00182ee9_caseD_5;
              pcVar12 = pugi::xml_attribute::as_string((xml_attribute *)(local_258 + 0x20),"");
              std::__cxx11::string::string((string *)local_268,pcVar12,(allocator *)&local_1f8);
              cVar13 = std::
                       _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                               *)(anonymous_namespace)::name_to_component_type_abi_cxx11_,
                              (key_type *)local_268);
              if ((xml_node_struct *)local_268._0_8_ != (xml_node_struct *)local_258) {
                operator_delete((void *)local_268._0_8_,(ulong)(local_258._0_8_ + 1));
              }
              if (cVar13.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                  ._M_cur == (__node_type *)0x0) goto switchD_00182ee9_caseD_5;
              iVar10 = *(int *)((long)cVar13.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                                      ._M_cur + 0x28);
              local_268._0_8_ = pugi::xml_node::attribute(&local_310,"inputs");
              bVar6 = pugi::xml_attribute::operator!((xml_attribute *)local_268);
              if (bVar6) goto switchD_00182ee9_caseD_5;
              local_1f8._wrap._root =
                   (xml_node_struct *)pugi::xml_node::attribute(&local_310,"outputs");
              bVar6 = pugi::xml_attribute::operator!((xml_attribute *)&local_1f8);
              if (bVar6) goto switchD_00182ee9_caseD_5;
              local_2d0 = pugi::xml_node::attribute(&local_310,"controls");
              bVar6 = pugi::xml_attribute::operator!(&local_2d0);
              if (bVar6) goto switchD_00182ee9_caseD_5;
              uVar7 = pugi::xml_attribute::as_int((xml_attribute *)local_268,0);
              uVar8 = pugi::xml_attribute::as_int((xml_attribute *)&local_1f8,0);
              iVar9 = pugi::xml_attribute::as_int(&local_2d0,0);
              if (0x100 < iVar10) {
                if (iVar10 == 0x101) {
                  if (uVar7 != 8) {
                    __assert_fail("num_inputs == 8",
                                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                  ,0x18e,
                                  "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                                 );
                  }
                  if (uVar8 != 0) {
                    __assert_fail("num_outputs == 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                  ,399,
                                  "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                                 );
                  }
                  if (iVar9 != 1) {
                    __assert_fail("num_controls == 1",
                                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                  ,400,
                                  "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                                 );
                  }
                  this_00 = ModelCircuit::add_7_segment_led(local_2f8);
                  goto LAB_00183907;
                }
                if (iVar10 == 0x301) {
                  local_2f0 = pugi::xml_node::attribute(&local_310,"nested");
                  bVar6 = pugi::xml_attribute::operator!(&local_2f0);
                  if (!bVar6) {
                    pcVar12 = pugi::xml_attribute::as_string(&local_2f0,"");
                    this_00 = ModelCircuit::add_sub_circuit(local_2f8,pcVar12,uVar7,uVar8);
                    local_320._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute(&local_310,"property","key","flip")
                    ;
                    bVar6 = pugi::xml_node::operator!((xml_node *)&local_320);
                    if (!bVar6) {
                      pPVar14 = ModelComponent::property(this_00,"flip");
                      local_318 = pugi::xml_node::attribute((xml_node *)&local_320,"value");
                      bVar6 = pugi::xml_attribute::as_bool(&local_318,false);
                      (*pPVar14->_vptr_Property[10])(pPVar14,(ulong)bVar6);
                    }
                    local_318._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_310,"property","key","caption");
                    bVar6 = pugi::xml_node::operator!((xml_node *)&local_318);
                    if (!bVar6) {
                      pPVar14 = ModelComponent::property(this_00,"caption");
                      local_308 = pugi::xml_node::attribute((xml_node *)&local_318,"value");
                      pcVar12 = pugi::xml_attribute::as_string(&local_308,"");
                      (*pPVar14->_vptr_Property[8])(pPVar14,pcVar12);
                    }
                    goto LAB_00183907;
                  }
                }
                else if (iVar10 == 0x401) {
                  local_2f0._attr =
                       (xml_attribute_struct *)
                       pugi::xml_node::find_child_by_attribute(&local_310,"property","key","text");
                  bVar6 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                  if (!bVar6) {
                    local_320 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                    bVar6 = pugi::xml_attribute::operator!(&local_320);
                    if (!bVar6) {
                      pcVar12 = pugi::xml_attribute::value(&local_320);
                      this_00 = ModelCircuit::add_text(local_2f8,pcVar12);
                      goto LAB_00183907;
                    }
                  }
                }
                goto switchD_00182ee9_caseD_5;
              }
              switch(iVar10) {
              case 1:
                if (uVar7 != 0) {
                  __assert_fail("num_inputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x119,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 == 0) {
                  __assert_fail("num_outputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x11a,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x11b,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_310,"property","key","name");
                bVar6 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar6) {
                  local_320 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar6 = pugi::xml_attribute::operator!(&local_320);
                  if (!bVar6) {
                    local_318._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_310,"property","key","tri_state");
                    bVar6 = pugi::xml_node::operator!((xml_node *)&local_318);
                    if (!bVar6) {
                      local_308 = pugi::xml_node::attribute((xml_node *)&local_318,"value");
                      bVar6 = pugi::xml_attribute::operator!(&local_308);
                      if (!bVar6) {
                        pcVar12 = pugi::xml_attribute::as_string(&local_320,"");
                        bVar6 = pugi::xml_attribute::as_bool(&local_308,false);
                        this_00 = ModelCircuit::add_connector_in(local_2f8,pcVar12,uVar8,bVar6);
                        local_2e8 = (Point)pugi::xml_node::find_child_by_attribute
                                                     (&local_310,"property","key","descending");
                        bVar6 = pugi::xml_node::operator!((xml_node *)&local_2e8);
                        if (!bVar6) {
                          pPVar14 = ModelComponent::property(this_00,"descending");
                          local_2d8 = (Point)pugi::xml_node::attribute
                                                       ((xml_node *)&local_2e8,"value");
                          bVar6 = pugi::xml_attribute::as_bool((xml_attribute *)&local_2d8,false);
                          (*pPVar14->_vptr_Property[10])(pPVar14,(ulong)bVar6);
                        }
                        break;
                      }
                    }
                  }
                }
                goto switchD_00182ee9_caseD_5;
              case 2:
                if (uVar7 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x127,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 0) {
                  __assert_fail("num_outputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x128,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x129,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_310,"property","key","name");
                bVar6 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar6) {
                  local_320 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar6 = pugi::xml_attribute::operator!(&local_320);
                  if (!bVar6) {
                    local_318._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_310,"property","key","tri_state");
                    bVar6 = pugi::xml_node::operator!((xml_node *)&local_318);
                    if (!bVar6) {
                      local_308 = pugi::xml_node::attribute((xml_node *)&local_318,"value");
                      bVar6 = pugi::xml_attribute::operator!(&local_308);
                      if (!bVar6) {
                        pcVar12 = pugi::xml_attribute::as_string(&local_320,"");
                        bVar6 = pugi::xml_attribute::as_bool(&local_308,false);
                        this_00 = ModelCircuit::add_connector_out(local_2f8,pcVar12,uVar7,bVar6);
                        local_2e8 = (Point)pugi::xml_node::find_child_by_attribute
                                                     (&local_310,"property","key","descending");
                        bVar6 = pugi::xml_node::operator!((xml_node *)&local_2e8);
                        if (!bVar6) {
                          pPVar14 = ModelComponent::property(this_00,"descending");
                          local_2d8 = (Point)pugi::xml_node::attribute
                                                       ((xml_node *)&local_2e8,"value");
                          bVar6 = pugi::xml_attribute::as_bool((xml_attribute *)&local_2d8,false);
                          (*pPVar14->_vptr_Property[10])(pPVar14,(ulong)bVar6);
                        }
                        break;
                      }
                    }
                  }
                }
                goto switchD_00182ee9_caseD_5;
              case 3:
                if (uVar7 != 0) {
                  __assert_fail("num_inputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x135,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x136,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x137,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_310,"property","key","value");
                bVar6 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar6) {
                  local_320 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar6 = pugi::xml_attribute::operator!(&local_320);
                  if (!bVar6) {
                    this_00 = ModelCircuit::add_constant(local_2f8,VALUE_FALSE);
                    pPVar14 = ModelComponent::property(this_00,"value");
                    pcVar12 = pugi::xml_attribute::value(&local_320);
                    (*pPVar14->_vptr_Property[8])(pPVar14,pcVar12);
                    break;
                  }
                }
                goto switchD_00182ee9_caseD_5;
              case 4:
                if (uVar7 != 0) {
                  __assert_fail("num_inputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x13e,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x13f,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x140,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_310,"property","key","pull_to");
                bVar6 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar6) {
                  local_320 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar6 = pugi::xml_attribute::operator!(&local_320);
                  if (!bVar6) {
                    this_00 = ModelCircuit::add_pull_resistor(local_2f8,VALUE_FALSE);
                    pPVar14 = ModelComponent::property(this_00,"pull_to");
                    pcVar12 = pugi::xml_attribute::value(&local_320);
                    (*pPVar14->_vptr_Property[8])(pPVar14,pcVar12);
                    break;
                  }
                }
              default:
                goto switchD_00182ee9_caseD_5;
              case 0x11:
                if (uVar7 != uVar8) {
                  __assert_fail("num_inputs == num_outputs",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x147,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x148,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_buffer(local_2f8,uVar7);
                break;
              case 0x12:
                if (uVar7 != uVar8) {
                  __assert_fail("num_inputs == num_outputs",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x14c,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 1) {
                  __assert_fail("num_controls == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x14d,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_tristate_buffer(local_2f8,uVar7);
                break;
              case 0x13:
                if (uVar7 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x151,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x152,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x153,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_and_gate(local_2f8,uVar7);
                break;
              case 0x14:
                if (uVar7 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x157,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x158,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x159,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_or_gate(local_2f8,uVar7);
                break;
              case 0x15:
                if (uVar7 != 1) {
                  __assert_fail("num_inputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x15d,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x15e,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x15f,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_not_gate(local_2f8);
                break;
              case 0x16:
                if (uVar7 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x163,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x164,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x165,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_nand_gate(local_2f8,uVar7);
                break;
              case 0x17:
                if (uVar7 == 0) {
                  __assert_fail("num_inputs > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x169,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x16a,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x16b,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_nor_gate(local_2f8,uVar7);
                break;
              case 0x18:
                if (uVar7 != 2) {
                  __assert_fail("num_inputs == 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x16f,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x170,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x171,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_xor_gate(local_2f8);
                break;
              case 0x19:
                if (uVar7 != 2) {
                  __assert_fail("num_inputs == 2",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x175,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x176,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x177,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                this_00 = ModelCircuit::add_xnor_gate(local_2f8);
                break;
              case 0x20:
                if (uVar7 == 0) {
                  __assert_fail("num_inputs >= 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x17b,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 0) {
                  __assert_fail("num_outputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x17c,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x17d,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute(&local_310,"property","key","name");
                bVar6 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar6) {
                  local_320 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar6 = pugi::xml_attribute::operator!(&local_320);
                  if (!bVar6) {
                    local_318._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_310,"property","key","right");
                    bVar6 = pugi::xml_node::operator!((xml_node *)&local_318);
                    if (!bVar6) {
                      local_308 = pugi::xml_node::attribute((xml_node *)&local_318,"value");
                      bVar6 = pugi::xml_attribute::operator!(&local_308);
                      if (!bVar6) {
                        pcVar12 = pugi::xml_attribute::as_string(&local_320,"");
                        this_00 = ModelCircuit::add_via(local_2f8,pcVar12,uVar7);
                        pPVar14 = ModelComponent::property(this_00,"right");
                        bVar6 = pugi::xml_attribute::as_bool(&local_308,false);
                        (*pPVar14->_vptr_Property[10])(pPVar14,(ulong)bVar6);
                        break;
                      }
                    }
                  }
                }
                goto switchD_00182ee9_caseD_5;
              case 0x21:
                if (uVar7 != 0) {
                  __assert_fail("num_inputs == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x185,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (uVar8 != 1) {
                  __assert_fail("num_outputs == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x186,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                if (iVar9 != 0) {
                  __assert_fail("num_controls == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                                ,0x187,
                                "bool (anonymous namespace)::Deserializer::parse_component(pugi::xml_node &, ModelCircuit *)"
                               );
                }
                local_2f0._attr =
                     (xml_attribute_struct *)
                     pugi::xml_node::find_child_by_attribute
                               (&local_310,"property","key","low_duration");
                bVar6 = pugi::xml_node::operator!((xml_node *)&local_2f0);
                if (!bVar6) {
                  local_320 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                  bVar6 = pugi::xml_attribute::operator!(&local_320);
                  if (!bVar6) {
                    local_318._attr =
                         (xml_attribute_struct *)
                         pugi::xml_node::find_child_by_attribute
                                   (&local_310,"property","key","high_duration");
                    bVar6 = pugi::xml_node::operator!((xml_node *)&local_318);
                    if (!bVar6) {
                      local_308 = pugi::xml_node::attribute((xml_node *)&local_318,"value");
                      bVar6 = pugi::xml_attribute::operator!(&local_308);
                      if (!bVar6) {
                        uVar7 = pugi::xml_attribute::as_int(&local_320,0);
                        uVar8 = pugi::xml_attribute::as_int(&local_308,0);
                        this_00 = ModelCircuit::add_oscillator(local_2f8,uVar7,uVar8);
                        break;
                      }
                    }
                  }
                }
                goto switchD_00182ee9_caseD_5;
              }
LAB_00183907:
              local_2f0._attr =
                   (xml_attribute_struct *)
                   pugi::xml_node::find_child_by_attribute
                             (&local_310,"property","key","initial_output");
              bVar6 = pugi::xml_node::operator!((xml_node *)&local_2f0);
              if (!bVar6) {
                pPVar14 = ModelComponent::property(this_00,"initial_output");
                local_320 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                pcVar12 = pugi::xml_attribute::value(&local_320);
                (*pPVar14->_vptr_Property[8])(pPVar14,pcVar12);
              }
              local_320._attr = (xml_attribute_struct *)pugi::xml_node::child(&local_310,"position")
              ;
              bVar6 = pugi::xml_node::operator!((xml_node *)&local_320);
              if (bVar6) {
LAB_0018399b:
                local_318._attr =
                     (xml_attribute_struct *)pugi::xml_node::child(&local_310,"orientation");
                bVar6 = pugi::xml_node::operator!((xml_node *)&local_318);
                if (!bVar6) {
                  local_308 = pugi::xml_node::attribute((xml_node *)&local_318,"angle");
                  bVar6 = pugi::xml_attribute::operator!(&local_308);
                  if (bVar6) goto switchD_00182ee9_caseD_5;
                  iVar10 = pugi::xml_attribute::as_int(&local_308,0);
                  ModelComponent::set_angle(this_00,iVar10);
                }
                if (this_00 != (ModelComponent *)0x0) {
                  mVar2 = this_00->m_id;
                  iVar10 = pugi::xml_attribute::as_int((xml_attribute *)&local_1d8,0);
                  local_308._attr._0_4_ = iVar10;
                  pmVar15 = std::__detail::
                            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                          *)&local_68,(key_type *)&local_308);
                  *pmVar15 = mVar2;
                }
              }
              else {
                local_318 = pugi::xml_node::attribute((xml_node *)&local_320,"x");
                bVar6 = pugi::xml_attribute::operator!(&local_318);
                if (!bVar6) {
                  local_308 = pugi::xml_node::attribute((xml_node *)&local_320,"y");
                  bVar6 = pugi::xml_attribute::operator!(&local_308);
                  if (!bVar6) {
                    fVar20 = pugi::xml_attribute::as_float(&local_318,0.0);
                    fVar21 = pugi::xml_attribute::as_float(&local_308,0.0);
                    Point::Point(&local_2e8,fVar20,fVar21);
                    ModelComponent::set_position(this_00,&local_2e8);
                    goto LAB_0018399b;
                  }
                }
              }
switchD_00182ee9_caseD_5:
              pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)local_288);
              bVar6 = pugi::xml_named_node_iterator::operator!=
                                ((xml_named_node_iterator *)local_288,&local_218);
            }
            pugi::xml_node::children
                      ((xml_object_range<pugi::xml_named_node_iterator> *)local_268,&local_2c8,
                       "wire");
            local_228 = (xml_node_struct *)local_258._0_8_;
            local_258._32_8_ = local_268._0_8_;
            pxStack_230 = (xml_node_struct *)local_268._8_8_;
            local_1f8._name = (char_t *)local_258._24_8_;
            local_1f8._wrap._root = (xml_node_struct *)local_258._8_8_;
            local_1f8._parent._root = (xml_node_struct *)local_258._16_8_;
            bVar6 = pugi::xml_named_node_iterator::operator!=
                              ((xml_named_node_iterator *)(local_258 + 0x20),&local_1f8);
            while (bVar6 != false) {
              pxVar11 = pugi::xml_named_node_iterator::operator*
                                  ((xml_named_node_iterator *)(local_258 + 0x20));
              local_2d0._attr = (xml_attribute_struct *)pxVar11->_root;
              local_200 = ModelCircuit::create_wire(local_2f8);
              pugi::xml_node::children(&local_2b8,(xml_node *)&local_2d0,"segment");
              local_288._16_8_ = local_2b8._begin._name;
              local_288._0_8_ = local_2b8._begin._wrap._root;
              local_288._8_8_ = local_2b8._begin._parent._root;
              local_218._name = local_2b8._end._name;
              local_218._wrap._root = local_2b8._end._wrap._root;
              local_218._parent._root = local_2b8._end._parent._root;
              bVar6 = pugi::xml_named_node_iterator::operator!=
                                ((xml_named_node_iterator *)local_288,&local_218);
              while (bVar6 != false) {
                pxVar11 = pugi::xml_named_node_iterator::operator*
                                    ((xml_named_node_iterator *)local_288);
                local_1d8._wrap._root = pxVar11->_root;
                local_2f0 = pugi::xml_node::attribute(&local_1d8._wrap,"x1");
                bVar6 = pugi::xml_attribute::operator!(&local_2f0);
                if (bVar6) goto LAB_00183efd;
                local_320 = pugi::xml_node::attribute(&local_1d8._wrap,"y1");
                bVar6 = pugi::xml_attribute::operator!(&local_320);
                if (bVar6) goto LAB_00183efd;
                local_318 = pugi::xml_node::attribute(&local_1d8._wrap,"x2");
                bVar6 = pugi::xml_attribute::operator!(&local_318);
                if (bVar6) goto LAB_00183efd;
                local_308 = pugi::xml_node::attribute(&local_1d8._wrap,"y2");
                bVar6 = pugi::xml_attribute::operator!(&local_308);
                if (bVar6) goto LAB_00183efd;
                fVar20 = pugi::xml_attribute::as_float(&local_2f0,0.0);
                fVar21 = pugi::xml_attribute::as_float(&local_320,0.0);
                Point::Point(&local_2e8,fVar20,fVar21);
                fVar20 = pugi::xml_attribute::as_float(&local_318,0.0);
                fVar21 = pugi::xml_attribute::as_float(&local_308,0.0);
                Point::Point(&local_2d8,fVar20,fVar21);
                ModelWire::add_segment(local_200,&local_2e8,&local_2d8);
                pugi::xml_named_node_iterator::operator++((xml_named_node_iterator *)local_288);
                bVar6 = pugi::xml_named_node_iterator::operator!=
                                  ((xml_named_node_iterator *)local_288,&local_218);
              }
              pugi::xml_node::children(&local_2b8,(xml_node *)&local_2d0,"pin");
              local_218._name = local_2b8._begin._name;
              local_218._wrap._root = local_2b8._begin._wrap._root;
              local_218._parent._root = local_2b8._begin._parent._root;
              local_1d8._name = local_2b8._end._name;
              local_1d8._wrap._root = local_2b8._end._wrap._root;
              local_1d8._parent._root = local_2b8._end._parent._root;
              bVar6 = pugi::xml_named_node_iterator::operator!=(&local_218,&local_1d8);
              while (bVar6 != false) {
                pxVar11 = pugi::xml_named_node_iterator::operator*(&local_218);
                local_2f0._attr = (xml_attribute_struct *)pxVar11->_root;
                local_320 = pugi::xml_node::attribute((xml_node *)&local_2f0,"value");
                bVar6 = pugi::xml_attribute::operator!(&local_320);
                if (bVar6) break;
                pcVar12 = pugi::xml_attribute::as_string(&local_320,"");
                std::__cxx11::string::string((string *)local_288,pcVar12,(allocator *)&local_318);
                lVar16 = std::__cxx11::string::find((char)(xml_named_node_iterator *)local_288,0x23)
                ;
                if (lVar16 == -1) {
                  error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                            ,"Unparseable location \"%s\"; should contain a comma");
                }
                else {
                  uVar17 = strtol((char *)local_288._0_8_,(char **)0x0,0);
                  uVar18 = (uVar17 & 0xffffffff) % local_68._M_bucket_count;
                  if (local_68._M_buckets[uVar18] != (__node_base_ptr)0x0) {
                    p_Var19 = local_68._M_buckets[uVar18]->_M_nxt;
                    uVar3 = *(uint *)&p_Var19[1]._M_nxt;
                    do {
                      if (uVar3 == (uint)uVar17) goto LAB_00183e6b;
                      p_Var19 = p_Var19->_M_nxt;
                    } while ((p_Var19 != (_Hash_node_base *)0x0) &&
                            (uVar3 = *(uint *)&p_Var19[1]._M_nxt,
                            (ulong)uVar3 % local_68._M_bucket_count == uVar18));
                  }
                  error_msg("/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/serialize.cpp"
                            ,"Unknown component-id \"%d\" in wire",uVar17);
                  p_Var19 = (_Hash_node_base *)0x0;
LAB_00183e6b:
                  uVar3 = *(uint *)((long)&p_Var19[1]._M_nxt + 4);
                  uVar17 = strtol((char *)((long)(uintptr_t *)local_288._0_8_ + lVar16 + 1),
                                  (char **)0x0,0);
                  ModelWire::add_pin(local_200,uVar17 & 0xffffffff | (ulong)uVar3 << 0x20);
                }
                if ((xml_node_struct *)local_288._0_8_ != (xml_node_struct *)(local_288 + 0x10)) {
                  operator_delete((void *)local_288._0_8_,(ulong)(local_288._16_8_ + 1));
                }
                if (lVar16 == -1) break;
                pugi::xml_named_node_iterator::operator++(&local_218);
                bVar6 = pugi::xml_named_node_iterator::operator!=(&local_218,&local_1d8);
              }
LAB_00183efd:
              pugi::xml_named_node_iterator::operator++
                        ((xml_named_node_iterator *)(local_258 + 0x20));
              bVar6 = pugi::xml_named_node_iterator::operator!=
                                ((xml_named_node_iterator *)(local_258 + 0x20),&local_1f8);
            }
          }
          pugi::xml_named_node_iterator::operator++(&local_1b8);
          bVar6 = pugi::xml_named_node_iterator::operator!=(&local_1b8,&local_168);
        } while (bVar6);
      }
      local_2b8._begin._wrap = pugi::xml_node::child(&local_2c0,"main");
      bVar6 = pugi::xml_node::operator!((xml_node *)&local_2b8);
      if (!bVar6) {
        local_268._0_8_ = pugi::xml_node::attribute((xml_node *)&local_2b8,"name");
        bVar6 = pugi::xml_attribute::operator!((xml_attribute *)local_268);
        if (bVar6) goto LAB_00184018;
        pcVar12 = pugi::xml_attribute::as_string((xml_attribute *)local_268,"");
        psVar1 = &local_2e0->m_main_circuit;
        pcVar4 = (char *)(local_2e0->m_main_circuit)._M_string_length;
        strlen(pcVar12);
        std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar4,(ulong)pcVar12);
      }
      if ((local_2e0->m_circuits).
          super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (local_2e0->m_circuits).
          super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        idx = 0;
        do {
          this_01 = ModelCircuitLibrary::circuit_by_idx(local_2e0,idx);
          ModelCircuit::sync_sub_circuit_components(this_01);
          idx = idx + 1;
        } while (idx < (ulong)((long)(local_2e0->m_circuits).
                                     super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(local_2e0->m_circuits).
                                     super__Vector_base<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>,_std::allocator<std::unique_ptr<lsim::ModelCircuit,_std::default_delete<lsim::ModelCircuit>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
  }
LAB_00184018:
  uVar5 = local_2f9;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  pugi::xml_document::~xml_document(&local_148);
  return (bool)uVar5;
}

Assistant:

bool deserialize_library(LSimContext *context, ModelCircuitLibrary *lib, const char *filename) {
    assert(context);
    assert(lib);
    assert(filename);

    Deserializer deserializer(context);
    
    if (!deserializer.load_from_file(filename)) {
        return false;
    }

    deserializer.parse_library(lib);

    return true;
}